

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

char * __thiscall
CoreML::Specification::ReduceLayerParams::_InternalParse
          (ReduceLayerParams *this,char *ptr,ParseContext *ctx)

{
  uint tag_00;
  bool bVar1;
  uint uVar2;
  uint64_t uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unknown;
  float fVar4;
  uint64_t val_1;
  uint64_t val;
  ParseContext *pPStack_20;
  uint32_t tag;
  ParseContext *ctx_local;
  char *ptr_local;
  ReduceLayerParams *this_local;
  
  pPStack_20 = ctx;
  ctx_local = (ParseContext *)ptr;
  ptr_local = (char *)this;
LAB_00319abc:
  do {
    bVar1 = google::protobuf::internal::ParseContext::Done(pPStack_20,(char **)&ctx_local);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      return (char *)ctx_local;
    }
    ctx_local = (ParseContext *)
                google::protobuf::internal::ReadTag
                          ((char *)ctx_local,(uint32_t *)((long)&val + 4),0);
    tag_00 = val._4_4_;
    uVar2 = val._4_4_ >> 3;
    if (uVar2 == 1) {
      if ((val._4_4_ & 0xff) == 8) {
        uVar3 = google::protobuf::internal::ReadVarint64((char **)&ctx_local);
        if (ctx_local == (ParseContext *)0x0) {
          return (char *)0x0;
        }
        _internal_set_mode(this,(ReduceLayerParams_ReduceOperation)uVar3);
        goto LAB_00319abc;
      }
    }
    else if (uVar2 == 2) {
      if ((val._4_4_ & 0xff) == 0x15) {
        fVar4 = google::protobuf::internal::UnalignedLoad<float>((char *)ctx_local);
        this->epsilon_ = fVar4;
        ctx_local = (ParseContext *)((long)&(ctx_local->super_EpsCopyInputStream).limit_end_ + 4);
        goto LAB_00319abc;
      }
    }
    else if ((uVar2 == 3) && ((val._4_4_ & 0xff) == 0x18)) {
      uVar3 = google::protobuf::internal::ReadVarint64((char **)&ctx_local);
      if (ctx_local == (ParseContext *)0x0) {
        return (char *)0x0;
      }
      _internal_set_axis(this,(ReduceLayerParams_ReduceAxis)uVar3);
      goto LAB_00319abc;
    }
    if ((val._4_4_ == 0) || ((val._4_4_ & 7) == 4)) {
      if (ctx_local == (ParseContext *)0x0) {
        return (char *)0x0;
      }
      google::protobuf::internal::EpsCopyInputStream::SetLastTag
                (&pPStack_20->super_EpsCopyInputStream,val._4_4_);
      return (char *)ctx_local;
    }
    unknown = google::protobuf::internal::InternalMetadata::
              mutable_unknown_fields<std::__cxx11::string>
                        (&(this->super_MessageLite)._internal_metadata_);
    ctx_local = (ParseContext *)
                google::protobuf::internal::UnknownFieldParse
                          (tag_00,unknown,(char *)ctx_local,pPStack_20);
    if (ctx_local == (ParseContext *)0x0) {
      return (char *)0x0;
    }
  } while( true );
}

Assistant:

const char* ReduceLayerParams::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  while (!ctx->Done(&ptr)) {
    uint32_t tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    switch (tag >> 3) {
      // .CoreML.Specification.ReduceLayerParams.ReduceOperation mode = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 8)) {
          uint64_t val = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
          _internal_set_mode(static_cast<::CoreML::Specification::ReduceLayerParams_ReduceOperation>(val));
        } else
          goto handle_unusual;
        continue;
      // float epsilon = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 21)) {
          epsilon_ = ::PROTOBUF_NAMESPACE_ID::internal::UnalignedLoad<float>(ptr);
          ptr += sizeof(float);
        } else
          goto handle_unusual;
        continue;
      // .CoreML.Specification.ReduceLayerParams.ReduceAxis axis = 3;
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 24)) {
          uint64_t val = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
          _internal_set_axis(static_cast<::CoreML::Specification::ReduceLayerParams_ReduceAxis>(val));
        } else
          goto handle_unusual;
        continue;
      default:
        goto handle_unusual;
    }  // switch
  handle_unusual:
    if ((tag == 0) || ((tag & 7) == 4)) {
      CHK_(ptr);
      ctx->SetLastTag(tag);
      goto message_done;
    }
    ptr = UnknownFieldParse(
        tag,
        _internal_metadata_.mutable_unknown_fields<std::string>(),
        ptr, ctx);
    CHK_(ptr != nullptr);
  }  // while
message_done:
  return ptr;
failure:
  ptr = nullptr;
  goto message_done;
#undef CHK_
}